

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defineCallOpen.hh
# Opt level: O1

shared_ptr<discordpp::BotStruct::Call> __thiscall discordpp::BotStruct::Call::run(Call *this)

{
  long *plVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<discordpp::BotStruct::Call> sVar2;
  undefined1 local_39;
  RenderedCall *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  Call *local_28;
  
  plVar1 = *(long **)(in_RSI + 0x18);
  local_38 = (RenderedCall *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<discordpp::BotStruct::RenderedCall,std::allocator<discordpp::BotStruct::RenderedCall>,discordpp::BotStruct::Call*>
            (&local_30,&local_38,(allocator<discordpp::BotStruct::RenderedCall> *)&local_39,
             &local_28);
  (**(code **)(*plVar1 + 0x38))(plVar1,&local_38);
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  std::__shared_ptr<discordpp::BotStruct::Call,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<discordpp::BotStruct::Call,void>
            ((__shared_ptr<discordpp::BotStruct::Call,(__gnu_cxx::_Lock_policy)2> *)this,
             (__weak_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8));
  sVar2.super___shared_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<discordpp::BotStruct::Call>)
         sVar2.super___shared_ptr<discordpp::BotStruct::Call,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto run() {
        bot_->doCall(render());
        return shared_from_this();
    }